

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_I1(double x)

{
  double dVar1;
  double dVar2;
  
  if ((x == 0.0) && (!NAN(x))) {
    return 0.0;
  }
  dVar1 = ABS(x);
  if (dVar1 < 4.450147717014403e-308) {
    fwrite("Underflow error in bessel_I1\n",0x1d,1,_stderr);
    dVar1 = 0.0;
  }
  else if (4.2146848510894035e-08 <= dVar1) {
    if (dVar1 <= 3.0) {
      dVar1 = xc_cheb_eval((x * x) / 4.5 + -1.0,bi1_data,0xb);
      dVar1 = (dVar1 + 0.875) * x;
    }
    else {
      dVar2 = exp(x);
      dVar1 = xc_bessel_I1_scaled(x);
      dVar1 = dVar1 * dVar2;
    }
  }
  else {
    dVar1 = x * 0.5;
  }
  return dVar1;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I1(const double x)
{
  const double xmin    = 2.0 * DBL_MIN;
  const double x_small = 2.0 * M_SQRT2 * SQRT_DBL_EPSILON;
  const double y = fabs(x);
  double r = 0.0;

  if(y == 0.0)
    r = 0.0;
  else if(y < xmin) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Underflow error in bessel_I1\n");
#endif
  } else if(y < x_small)
    r = 0.5*x;
  else if(y <= 3.0)
    r = x*(0.875 + xc_cheb_eval(y*y/4.5 - 1.0, bi1_data, 11));
  else
    r = exp(x)*xc_bessel_I1_scaled(x);

  return r;
}